

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::InternalSwap
          (GeneratedCodeInfo_Annotation *this,GeneratedCodeInfo_Annotation *other)

{
  uint32 uVar1;
  int iVar2;
  int32 iVar3;
  void *pvVar4;
  string *psVar5;
  UnknownFieldSet *other_00;
  
  pvVar4 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar4 & 1) == 0) goto LAB_002fb405;
LAB_002fb3f8:
    other_00 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar4 & 1) != 0) goto LAB_002fb3f8;
    other_00 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00);
LAB_002fb405:
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  pvVar4 = (this->path_).arena_or_elements_;
  (this->path_).arena_or_elements_ = (other->path_).arena_or_elements_;
  (other->path_).arena_or_elements_ = pvVar4;
  iVar2 = (this->path_).current_size_;
  (this->path_).current_size_ = (other->path_).current_size_;
  (other->path_).current_size_ = iVar2;
  iVar2 = (this->path_).total_size_;
  (this->path_).total_size_ = (other->path_).total_size_;
  (other->path_).total_size_ = iVar2;
  psVar5 = (this->source_file_).ptr_;
  (this->source_file_).ptr_ = (other->source_file_).ptr_;
  (other->source_file_).ptr_ = psVar5;
  iVar3 = this->begin_;
  this->begin_ = other->begin_;
  other->begin_ = iVar3;
  iVar3 = this->end_;
  this->end_ = other->end_;
  other->end_ = iVar3;
  return;
}

Assistant:

void GeneratedCodeInfo_Annotation::InternalSwap(GeneratedCodeInfo_Annotation* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  path_.InternalSwap(&other->path_);
  source_file_.Swap(&other->source_file_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(begin_, other->begin_);
  swap(end_, other->end_);
}